

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O3

xformDatabase * initXformDB(void)

{
  xformDatabase *__ptr;
  void *pvVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  
  __ptr = (xformDatabase *)malloc(0xb8);
  if (__ptr == (xformDatabase *)0x0) {
    warn("could not create transformation database");
  }
  else {
    pvVar1 = malloc(0x400);
    if (pvVar1 != (void *)0x0) {
      __ptr->xforms = (transformData *)0x0;
      __ptr->last = (transformData *)0x0;
      __ptr->nlevs = 0;
      __ptr->level[0] = (transformData *)0x0;
      __ptr->level[1] = (transformData *)0x0;
      __ptr->level[2] = (transformData *)0x0;
      __ptr->level[3] = (transformData *)0x0;
      __ptr->level[4] = (transformData *)0x0;
      __ptr->level[5] = (transformData *)0x0;
      __ptr->level[6] = (transformData *)0x0;
      __ptr->level[7] = (transformData *)0x0;
      lVar3 = 0;
      lVar4 = 1;
      lVar2 = 0xc;
      auVar5._8_4_ = (int)pvVar1;
      auVar5._0_8_ = pvVar1;
      auVar5._12_4_ = (int)((ulong)pvVar1 >> 0x20);
      do {
        __ptr->level[lVar2 + -3] = (transformData *)(lVar3 * 0x80 + (long)pvVar1);
        (__ptr->level + lVar2 + -3)[1] = (transformData *)(lVar4 * 0x80 + auVar5._8_8_);
        lVar3 = lVar3 + 2;
        lVar4 = lVar4 + 2;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x14);
      __ptr->nstack = 1;
      v3identityMat(__ptr->ctmstack[0]);
      __ptr->golist = (goToRec *)0x0;
      __ptr->glast = (goToRec *)0x0;
      __ptr->sortedByRes = (xformAtomRecords **)0x0;
      return __ptr;
    }
    warn("could not create transformation stack");
    free(__ptr);
  }
  return (xformDatabase *)0x0;
}

Assistant:

xformDatabase* initXformDB() {
   xformDatabase *xdb = NULL;
   matrix4 *mp = NULL;
   int i = 0;

   xdb = (xformDatabase *)malloc(sizeof(xformDatabase));
   if (!xdb) {
      warn("could not create transformation database");
      return NULL;
   }

   mp = (matrix4*)malloc(sizeof(matrix4)*MAX_XFORM_STACK_DEPTH);
   if (!mp) {
      warn("could not create transformation stack");
      if (xdb) { free(xdb); }
      return NULL;
   }

   xdb->xforms = xdb->last = NULL;

   xdb->nlevs = 0;
   for(i = 0; i < MAX_XFORM_LEVELS; i++) {
      xdb->level[i] = NULL;
   }

   xdb->nstack = 0;
   for(i = 0; i < MAX_XFORM_STACK_DEPTH; i++) {
      xdb->ctmstack[i] = &(mp[i]);
   }
   initializeXFStack(xdb);

   xdb->golist = xdb->glast = NULL;

   xdb->sortedByRes = NULL;

   return xdb;
}